

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxerutil.cc
# Opt level: O1

uint64 mkvmuxer::EbmlElementSize(uint64 type,int64 value)

{
  int32 iVar1;
  int iVar2;
  
  iVar2 = 2;
  if ((((0xff < type) && (iVar2 = 3, 0xffff < type)) && (iVar2 = 4, 0xffffff < type)) &&
     (((iVar2 = 5, type >> 0x20 != 0 && (iVar2 = 6, type >> 0x28 != 0)) &&
      (iVar2 = 7, type >> 0x30 != 0)))) {
    iVar2 = 9 - (uint)(type >> 0x38 == 0);
  }
  iVar1 = GetIntSize(value);
  return (ulong)(uint)(iVar1 + iVar2);
}

Assistant:

uint64 EbmlElementSize(uint64 type, int64 value) {
  // Size of EBML ID
  int32 ebml_size = GetUIntSize(type);

  // Datasize
  ebml_size += GetIntSize(value);

  // Size of Datasize
  ebml_size++;

  return ebml_size;
}